

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

operand_immediate_type assembler::anon_unknown_0::get_operand_immediate_type(operation *op)

{
  operation *op_local;
  
  switch(*op) {
  case CALL:
    op_local._4_4_ = _32BIT;
    break;
  default:
    op_local._4_4_ = _VARIABLE;
    break;
  case JMP:
    op_local._4_4_ = _32BIT;
    break;
  case JA:
    op_local._4_4_ = _32BIT;
    break;
  case JB:
    op_local._4_4_ = _32BIT;
    break;
  case JE:
    op_local._4_4_ = _32BIT;
    break;
  case JL:
    op_local._4_4_ = _32BIT;
    break;
  case JLE:
    op_local._4_4_ = _32BIT;
    break;
  case JG:
    op_local._4_4_ = _32BIT;
    break;
  case JGE:
    op_local._4_4_ = _32BIT;
    break;
  case JNE:
    op_local._4_4_ = _32BIT;
    break;
  case JMPS:
    op_local._4_4_ = _8BIT;
    break;
  case JAS:
    op_local._4_4_ = _8BIT;
    break;
  case JBS:
    op_local._4_4_ = _8BIT;
    break;
  case JES:
    op_local._4_4_ = _8BIT;
    break;
  case JLS:
    op_local._4_4_ = _8BIT;
    break;
  case JLES:
    op_local._4_4_ = _8BIT;
    break;
  case JGS:
    op_local._4_4_ = _8BIT;
    break;
  case JGES:
    op_local._4_4_ = _8BIT;
    break;
  case JNES:
    op_local._4_4_ = _8BIT;
  }
  return op_local._4_4_;
}

Assistant:

operand_immediate_type get_operand_immediate_type(const asmcode::operation& op)
    {
    switch (op)
      {
      case asmcode::CALL: return _32BIT;
      case asmcode::JE: return _32BIT;
      case asmcode::JL: return _32BIT;
      case asmcode::JLE:return _32BIT;
      case asmcode::JA: return _32BIT;
      case asmcode::JB: return _32BIT;
      case asmcode::JG: return _32BIT;
      case asmcode::JGE:return _32BIT;
      case asmcode::JNE:return _32BIT;
      case asmcode::JMP:return _32BIT;
      case asmcode::JES: return _8BIT;
      case asmcode::JLS: return _8BIT;
      case asmcode::JLES: return _8BIT;
      case asmcode::JAS: return _8BIT;
      case asmcode::JBS: return _8BIT;
      case asmcode::JGS: return _8BIT;
      case asmcode::JGES: return _8BIT;
      case asmcode::JNES: return _8BIT;
      case asmcode::JMPS: return _8BIT;
      default: return _VARIABLE;
      }
    }